

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_extb_32(m68k_info *info)

{
  if ((info->type & 0x1c) != 0) {
    MCInst_setOpcode(info->inst,0x54);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x4;
    (info->extension).operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
    (info->extension).operands[0].field_0.reg = (info->ir & 7) + M68K_REG_D0;
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_extb_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_d(info, M68K_INS_EXTB, 4);
}